

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

void __thiscall Epanet::Project::writeMsgLog(Project *this)

{
  char cVar1;
  string local_48 [39];
  allocator local_21;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&this->rptFile,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::string(local_48,"",&local_21);
    std::__cxx11::stringbuf::str((string *)&(this->network).field_0xaf8);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void Project::writeMsgLog()
    {
        if ( rptFile.is_open() )
        {
            rptFile << network.msgLog.str();
            network.msgLog.str("");
        }
    }